

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

void __thiscall
wasm::TypeUpdater::makeBlockUnreachableIfNoFallThrough(TypeUpdater *this,Block *curr)

{
  size_t sVar1;
  Expression **ppEVar2;
  size_t sVar3;
  
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1) &&
      (sVar1 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements, sVar1 != 0)) &&
     (ppEVar2 = (curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data,
     (ppEVar2[sVar1 - 1]->type).id < 2)) {
    sVar3 = 0;
    do {
      if ((ppEVar2[sVar3]->type).id == 1) {
        (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
        propagateTypesUp(this,(Expression *)curr);
        return;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void makeBlockUnreachableIfNoFallThrough(Block* curr) {
    if (curr->type == Type::unreachable) {
      return; // no change possible
    }
    if (!curr->list.empty() && curr->list.back()->type.isConcrete()) {
      // should keep type due to fallthrough, even if has an unreachable child
      return;
    }
    for (auto* child : curr->list) {
      if (child->type == Type::unreachable) {
        // no fallthrough, and an unreachable, => this block is now unreachable
        changeTypeTo(curr, Type::unreachable);
        return;
      }
    }
  }